

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_select_resp(connectdata *conn,int imapcode,imapstate instate)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  char local_58 [8];
  char tmp [20];
  char *line;
  imap_conn *imapc;
  IMAP *imap;
  Curl_easy *data;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  pvVar1 = (conn->data->req).protop;
  unique0x00012000 = (conn->data->state).buffer;
  if (imapcode == 0x2a) {
    iVar2 = __isoc99_sscanf(unique0x00012000 + 2,"OK [UIDVALIDITY %19[0123456789]]",local_58);
    if (iVar2 == 1) {
      (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
      (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
      pcVar3 = (*Curl_cstrdup)(local_58);
      (conn->proto).imapc.mailbox_uidvalidity = pcVar3;
    }
  }
  else if (imapcode == 1) {
    if (((*(long *)((long)pvVar1 + 0x10) == 0) ||
        ((conn->proto).imapc.mailbox_uidvalidity == (char *)0x0)) ||
       (iVar2 = Curl_strcasecompare(*(char **)((long)pvVar1 + 0x10),
                                    (conn->proto).imapc.mailbox_uidvalidity), iVar2 != 0)) {
      pcVar3 = (*Curl_cstrdup)(*(char **)((long)pvVar1 + 8));
      (conn->proto).imapc.mailbox = pcVar3;
      if (*(long *)((long)pvVar1 + 0x40) == 0) {
        if (*(long *)((long)pvVar1 + 0x38) == 0) {
          data._4_4_ = imap_perform_fetch(conn);
        }
        else {
          data._4_4_ = imap_perform_search(conn);
        }
      }
      else {
        data._4_4_ = imap_perform_list(conn);
      }
    }
    else {
      Curl_failf(conn->data,"Mailbox UIDVALIDITY has changed");
      data._4_4_ = CURLE_REMOTE_FILE_NOT_FOUND;
    }
  }
  else {
    Curl_failf(conn->data,"Select failed");
    data._4_4_ = CURLE_LOGIN_DENIED;
  }
  return data._4_4_;
}

Assistant:

static CURLcode imap_state_select_resp(struct connectdata *conn, int imapcode,
                                       imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct IMAP *imap = conn->data->req.protop;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *line = data->state.buffer;

  (void)instate; /* no use for this yet */

  if(imapcode == '*') {
    /* See if this is an UIDVALIDITY response */
    char tmp[20];
    if(sscanf(line + 2, "OK [UIDVALIDITY %19[0123456789]]", tmp) == 1) {
      Curl_safefree(imapc->mailbox_uidvalidity);
      imapc->mailbox_uidvalidity = strdup(tmp);
    }
  }
  else if(imapcode == IMAP_RESP_OK) {
    /* Check if the UIDVALIDITY has been specified and matches */
    if(imap->uidvalidity && imapc->mailbox_uidvalidity &&
       !strcasecompare(imap->uidvalidity, imapc->mailbox_uidvalidity)) {
      failf(conn->data, "Mailbox UIDVALIDITY has changed");
      result = CURLE_REMOTE_FILE_NOT_FOUND;
    }
    else {
      /* Note the currently opened mailbox on this connection */
      imapc->mailbox = strdup(imap->mailbox);

      if(imap->custom)
        result = imap_perform_list(conn);
      else if(imap->query)
        result = imap_perform_search(conn);
      else
        result = imap_perform_fetch(conn);
    }
  }
  else {
    failf(data, "Select failed");
    result = CURLE_LOGIN_DENIED;
  }

  return result;
}